

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall google::protobuf::internal::ExtensionSet::Clear(ExtensionSet *this)

{
  LargeMap *pLVar1;
  KeyValue *pKVar2;
  KeyValue *pKVar3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_> it;
  
  if (this->flat_capacity_ < 0x101) {
    pKVar2 = flat_begin(this);
    pKVar3 = flat_end(this);
    for (; pKVar2 != pKVar3; pKVar2 = pKVar2 + 1) {
      Extension::Clear(&pKVar2->second);
    }
  }
  else {
    pLVar1 = (this->map_).large;
    for (p_Var4 = (pLVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(pLVar1->_M_t)._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      Extension::Clear((Extension *)&p_Var4[1]._M_parent);
    }
  }
  return;
}

Assistant:

void ExtensionSet::Clear() {
  ForEach([](int /* number */, Extension& ext) { ext.Clear(); });
}